

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ReadOpCode
          (NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *this)

{
  TextReader<fmt::Locale> *unaff_retaddr;
  TextReader<fmt::Locale> *in_stack_00000008;
  CStringRef in_stack_00000010;
  int opcode;
  BasicCStringRef<char> local_18;
  int local_c;
  
  local_c = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x13437b);
  if (0x52 < local_c) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"invalid opcode {}");
    TextReader<fmt::Locale>::ReportError<int>
              (in_stack_00000008,in_stack_00000010,(int *)unaff_retaddr);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(unaff_retaddr);
  return local_c;
}

Assistant:

int ReadOpCode() {
    int opcode = reader_.ReadUInt();
    if (opcode > internal::MAX_OPCODE)
      reader_.ReportError("invalid opcode {}", opcode);
    reader_.ReadTillEndOfLine();
    return opcode;
  }